

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_>::
findFirstOverlap(NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_5U,_true>_>
                 *this,uint32_t i,uint32_t size,interval<unsigned_long> *key)

{
  interval<unsigned_long> *piVar1;
  ulong *in_RCX;
  uint in_EDX;
  uint in_ESI;
  BranchNode<unsigned_long,_5U,_true> *in_RDI;
  interval<unsigned_long> curr;
  BranchNode<unsigned_long,_5U,_true> *self;
  uint local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (in_EDX <= local_14) {
      return in_EDX;
    }
    piVar1 = BranchNode<unsigned_long,_5U,_true>::keyAt(in_RDI,local_14);
    if (in_RCX[1] < piVar1->left) break;
    if (*in_RCX <= piVar1->right) {
      return local_14;
    }
    local_14 = local_14 + 1;
  }
  return in_EDX;
}

Assistant:

uint32_t findFirstOverlap(uint32_t i, uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(i <= size);
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);

        for (; i < size; i++) {
            // Our left values are ordered, so if our right is before the
            // current left then there's no way anything here overlaps.
            auto curr = self.keyAt(i);
            if (curr.left > key.right)
                break;

            if (curr.right >= key.left)
                return i;
        }

        return size;
    }